

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  pointer pbVar1;
  _Alloc_hider __p;
  TargetType TVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  pointer config;
  string local_48;
  
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_00857680;
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)&(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != OBJECT_LIBRARY) {
    pvVar3 = cmCommonTargetGenerator::GetConfigNames_abi_cxx11_((cmCommonTargetGenerator *)this);
    pbVar1 = (pvVar3->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (config = (pvVar3->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; config != pbVar1; config = config + 1)
    {
      cmGeneratorTarget::GetDirectory(&local_48,target,config,RuntimeBinaryArtifact);
      cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  std::make_unique<cmOSXBundleGenerator,cmGeneratorTarget*&>((cmGeneratorTarget **)&local_48);
  __p._M_p = local_48._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::reset
            ((__uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> *)
             &(this->super_cmNinjaTargetGenerator).OSXBundleGenerator,(pointer)__p._M_p);
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::~unique_ptr
            ((unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> *)
             &local_48);
  ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator._M_t.
   super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
   super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
   super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl)->MacContentFolders =
       &(this->super_cmNinjaTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(
  cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
{
  if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    for (auto const& config : this->GetConfigNames()) {
      this->EnsureDirectoryExists(target->GetDirectory(config));
    }
  }

  this->OSXBundleGenerator = cm::make_unique<cmOSXBundleGenerator>(target);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}